

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::add_sample
          (TypedTimeSamples<tinyusdz::value::point3f> *this,double t,point3f *v)

{
  Sample s;
  Sample local_20;
  
  local_20.blocked = false;
  local_20.value.x = v->x;
  local_20.value.y = v->y;
  local_20.value.z = v->z;
  local_20.t = t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>>
              *)this,&local_20);
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }